

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O2

mz_uint (anonymous_namespace)::miniz::mz_zip_writer_compute_padding_needed_for_file_alignment
                  (mz_zip_archive *pZip)

{
  mz_uint mVar1;
  
  mVar1 = pZip->m_file_offset_alignment;
  if (mVar1 != 0) {
    return mVar1 - ((uint)pZip->m_archive_size & mVar1 - 1) & mVar1 - 1;
  }
  return 0;
}

Assistant:

static mz_uint
mz_zip_writer_compute_padding_needed_for_file_alignment(mz_zip_archive *pZip) {
  mz_uint32 n;
  if (!pZip->m_file_offset_alignment)
    return 0;
  n = (mz_uint32)(pZip->m_archive_size & (pZip->m_file_offset_alignment - 1));
  return (pZip->m_file_offset_alignment - n) &
         (pZip->m_file_offset_alignment - 1);
}